

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O2

int AF_A_MinotaurRoam(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  AMinotaurFriend *self1;
  AActor *actor;
  char *__assertion;
  long lVar6;
  DAngle angle;
  FName local_64;
  undefined8 local_60;
  VMValue params [3];
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054752a;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (actor == (AActor *)0x0) {
LAB_0054733d:
        actor = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054752a;
        }
      }
      if (numparam == 1) goto LAB_005473bd;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054751a;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054752a;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054751a;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005473bd:
        actor->RenderStyle = LegacyRenderStyles[1];
        bVar3 = DObject::IsKindOf((DObject *)actor,AMinotaurFriend::RegistrationInfo.MyClass);
        if (((bVar3) && (-1 < *(int *)&actor->field_0x49c)) &&
           (0x36a < level.maptime - *(int *)&actor->field_0x49c)) {
          local_64.Index = 0;
          local_60 = 0;
          P_DamageMobj(actor,(AActor *)0x0,(AActor *)0x0,1000000,&local_64,0,angle);
        }
        else {
          iVar4 = FRandom::operator()(&pr_minotaurroam);
          if (iVar4 < 0x1e) {
            params[0].field_0._8_4_ = 1;
            params[0].field_0.field_3.Type = '\x03';
            params[1].field_0.field_3.Type = '\x03';
            params[2].field_0.field_1.a = (void *)0x0;
            params[2].field_0.field_1.atag = 8;
            params[2].field_0.field_3.Type = '\x03';
            params[0].field_0._0_8_ = actor;
            params[1].field_0._0_8_ = actor;
            params[1].field_0._8_4_ = params[0].field_0._8_4_;
            VMFrameStack::Call(stack,&A_MinotaurLook_VMPtr->super_VMFunction,params,3,
                               (VMReturn *)0x0,0,(VMException **)0x0);
            lVar6 = 0x20;
            do {
              VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar6));
              lVar6 = lVar6 + -0x10;
            } while (lVar6 != -0x10);
          }
          iVar4 = FRandom::operator()(&pr_minotaurroam);
          if (iVar4 < 6) {
            iVar4 = FRandom::operator()(&pr_minotaurroam);
            actor->movedir = (BYTE)(iVar4 % 8);
            FaceMovementDirection(actor);
          }
          bVar3 = P_Move(actor);
          if (!bVar3) {
            uVar5 = FRandom::operator()(&pr_minotaurroam);
            cVar2 = '\x01';
            if ((uVar5 & 1) == 0) {
              cVar2 = '\a';
            }
            actor->movedir = cVar2 + actor->movedir & 7;
            FaceMovementDirection(actor);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054752a;
    }
    if (actor == (AActor *)0x0) goto LAB_0054733d;
  }
LAB_0054751a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054752a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x1bd,"int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurRoam)
{
	PARAM_ACTION_PROLOGUE;

	// In case pain caused him to skip his fade in.
	self->RenderStyle = STYLE_Normal;

	if (self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

		if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
		{
			P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
			return 0;
		}
	}

	if (pr_minotaurroam() < 30)
		CALL_ACTION(A_MinotaurLook, self);		// adjust to closest target

	if (pr_minotaurroam() < 6)
	{
		//Choose new direction
		self->movedir = pr_minotaurroam() % 8;
		FaceMovementDirection (self);
	}
	if (!P_Move(self))
	{
		// Turn
		if (pr_minotaurroam() & 1)
			self->movedir = (self->movedir + 1) % 8;
		else
			self->movedir = (self->movedir + 7) % 8;
		FaceMovementDirection (self);
	}
	return 0;
}